

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_begin_2d(rf_camera2d camera)

{
  rf_mat *prVar1;
  rf_context *prVar2;
  rf_float16 buffer_1;
  rf_float16 buffer;
  undefined1 in_stack_00000150 [24];
  float local_c8 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  
  rf_gfx_draw();
  prVar2 = rf__ctx;
  prVar1 = (rf__ctx->field_0).current_matrix;
  prVar1->m0 = 1.0;
  prVar1->m4 = 0.0;
  prVar1->m8 = 0.0;
  prVar1->m12 = 0.0;
  prVar1->m1 = 0.0;
  prVar1->m5 = 1.0;
  prVar1->m9 = 0.0;
  prVar1->m13 = 0.0;
  prVar1->m2 = 0.0;
  prVar1->m6 = 0.0;
  prVar1->m10 = 1.0;
  prVar1->m14 = 0.0;
  prVar1->m3 = 0.0;
  prVar1->m7 = 0.0;
  prVar1->m11 = 0.0;
  prVar1->m15 = 1.0;
  _local_88 = CONCAT44((prVar2->field_0).screen_scaling.m1,(prVar2->field_0).screen_scaling.m0);
  _fStack_80 = CONCAT44((prVar2->field_0).screen_scaling.m3,(prVar2->field_0).screen_scaling.m2);
  _local_78 = CONCAT44((prVar2->field_0).screen_scaling.m5,(prVar2->field_0).screen_scaling.m4);
  _fStack_70 = CONCAT44((prVar2->field_0).screen_scaling.m7,(prVar2->field_0).screen_scaling.m6);
  _local_68 = CONCAT44((prVar2->field_0).screen_scaling.m9,(prVar2->field_0).screen_scaling.m8);
  _fStack_60 = CONCAT44((prVar2->field_0).screen_scaling.m11,(prVar2->field_0).screen_scaling.m10);
  _local_58 = CONCAT44((prVar2->field_0).screen_scaling.m13,(prVar2->field_0).screen_scaling.m12);
  _fStack_50 = CONCAT44((prVar2->field_0).screen_scaling.m15,(prVar2->field_0).screen_scaling.m14);
  rf_gfx_mult_matrixf(&local_88);
  rf_get_camera_matrix2d((rf_camera2d)in_stack_00000150);
  rf_gfx_mult_matrixf(local_c8);
  return;
}

Assistant:

RF_API void rf_begin_2d(rf_camera2d camera)
{
    rf_gfx_draw();

    rf_gfx_load_identity(); // Reset current matrix (MODELVIEW)

    // Apply screen scaling if required
    rf_gfx_mult_matrixf(rf_mat_to_float16(rf_ctx.screen_scaling).v);

    // Apply 2d camera transformation to rf_gfxobal_model_view
    rf_gfx_mult_matrixf(rf_mat_to_float16(rf_get_camera_matrix2d(camera)).v);
}